

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall
tcu::Texture2D::Texture2D(Texture2D *this,TextureFormat *format,int width,int height)

{
  int iVar1;
  ConstPixelBufferAccess *levels;
  int height_local;
  int width_local;
  TextureFormat *format_local;
  Texture2D *this_local;
  
  iVar1 = computeMipPyramidLevels(width,height);
  TextureLevelPyramid::TextureLevelPyramid(&this->super_TextureLevelPyramid,format,iVar1);
  this->m_width = width;
  this->m_height = height;
  iVar1 = TextureLevelPyramid::getNumLevels(&this->super_TextureLevelPyramid);
  levels = &TextureLevelPyramid::getLevels(&this->super_TextureLevelPyramid)->
            super_ConstPixelBufferAccess;
  Texture2DView::Texture2DView(&this->m_view,iVar1,levels);
  return;
}

Assistant:

Texture2D::Texture2D (const TextureFormat& format, int width, int height)
	: TextureLevelPyramid	(format, computeMipPyramidLevels(width, height))
	, m_width				(width)
	, m_height				(height)
	, m_view				(getNumLevels(), getLevels())
{
}